

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

State * __thiscall duckdb_re2::DFA::WorkqToCachedState(DFA *this,Workq *q,Workq *mq,uint32_t flag)

{
  MatchKind MVar1;
  int iVar2;
  int *piVar3;
  Prog *pPVar4;
  Inst *pIVar5;
  byte bVar6;
  Workq *pWVar7;
  int *inst;
  ulong uVar8;
  State *pSVar9;
  int *piVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  int *ip;
  uint uVar16;
  bool bVar17;
  new_allocator<int> local_59;
  ulong local_58;
  DFA *local_50;
  ulong local_48;
  uint32_t local_3c;
  Workq *local_38;
  
  local_38 = mq;
  inst = __gnu_cxx::new_allocator<int>::allocate
                   (&local_59,(long)q->maxmark_ + (long)q->n_,(void *)0x0);
  if ((q->super_SparseSet).size_ == 0) {
    local_58 = 0;
    bVar17 = true;
    uVar15 = 0;
  }
  else {
    piVar3 = ((_Head_base<0UL,_int_*,_false> *)
             ((long)&(q->super_SparseSet).dense_.ptr_._M_t.
                     super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                     super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> + 8))->
             _M_head_impl;
    MVar1 = this->kind_;
    pPVar4 = this->prog_;
    lVar12 = 0;
    uVar15 = 0;
    local_58 = 0;
    bVar17 = false;
    bVar6 = 0;
    do {
      iVar2 = *(int *)((long)piVar3 + lVar12);
      if ((!bVar17) || ((uVar16 = 2, MVar1 != kFirstMatch && (iVar2 < q->n_)))) {
        if (iVar2 < q->n_) {
          pIVar5 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
                   ((long)&(pPVar4->inst_).ptr_._M_t.
                           super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                   + 8))->_M_head_impl;
          if (((pIVar5[iVar2].out_opcode_ & 7) == 1) && (MVar1 != kManyMatch)) {
            if (MVar1 == kLongestMatch) {
              uVar16 = 1;
              if (!(bool)((flag >> 8 & 1) == 0 | bVar6)) goto LAB_011e9d55;
            }
            else if (MVar1 == kFirstMatch) {
              if (lVar12 == 0) {
                uVar16 = pIVar5[pIVar5[iVar2].out_opcode_ >> 4].out_opcode_ & 7;
                if ((uVar16 == 2) ||
                   ((uVar16 == 6 &&
                    ((pIVar5[pIVar5[pIVar5[iVar2].out_opcode_ >> 4].out_opcode_ >> 4].out_opcode_ &
                     7) == 2)))) goto LAB_011e9d01;
              }
            }
            else {
LAB_011e9d01:
              uVar16 = 1;
              if ((flag >> 8 & 1) != 0) goto LAB_011e9d55;
            }
          }
          if ((pIVar5[(long)iVar2 + -1].out_opcode_ & 8) != 0) {
            lVar13 = (long)(int)uVar15;
            uVar15 = uVar15 + 1;
            inst[lVar13] = iVar2;
          }
          uVar14 = pIVar5[iVar2].out_opcode_ & 7;
          if (uVar14 == 4) {
            local_58 = (ulong)((uint)local_58 | pIVar5[iVar2].field_1.out1_);
          }
          uVar16 = 0;
          if ((uVar14 == 5) && (pPVar4->anchor_end_ == false)) {
            bVar17 = true;
          }
        }
        else {
          uVar16 = 4;
          if ((0 < (int)uVar15) && (inst[(ulong)uVar15 - 1] != -1)) {
            inst[uVar15] = -1;
            bVar6 = 1;
            uVar15 = uVar15 + 1;
          }
        }
      }
LAB_011e9d55:
      if ((uVar16 & 3) != 0) goto LAB_011e9d76;
      lVar12 = lVar12 + 4;
    } while (lVar12 != (long)(q->super_SparseSet).size_ * 4);
    uVar16 = 2;
LAB_011e9d76:
    bVar17 = uVar16 == 2;
  }
  pSVar9 = (State *)0x2;
  local_50 = this;
  if (bVar17) {
    uVar16 = uVar15;
    if ((0 < (int)uVar15) && (uVar16 = uVar15 - 1, inst[(long)(int)uVar15 + -1] != -1)) {
      uVar16 = uVar15;
    }
    uVar15 = flag & 0x100;
    if ((int)local_58 != 0) {
      uVar15 = flag;
    }
    if (uVar16 == 0 && uVar15 == 0) {
      pSVar9 = (State *)&DAT_00000001;
    }
    else {
      local_48 = (ulong)(int)uVar16;
      local_3c = uVar15;
      if ((this->kind_ == kLongestMatch) && (0 < (int)uVar16)) {
        piVar3 = inst + local_48;
        piVar11 = inst;
        do {
          piVar10 = piVar11;
          if (*piVar11 == -1) {
            lVar12 = 4;
          }
          else {
            do {
              piVar10 = piVar10 + 1;
              if (piVar3 <= piVar10) {
                lVar12 = 0;
                goto LAB_011e9e38;
              }
            } while (*piVar10 != -1);
            lVar12 = (ulong)(piVar10 < piVar3) << 2;
          }
LAB_011e9e38:
          if (piVar11 != piVar10) {
            uVar8 = (long)piVar10 - (long)piVar11 >> 2;
            lVar13 = 0x3f;
            if (uVar8 != 0) {
              for (; uVar8 >> lVar13 == 0; lVar13 = lVar13 + -1) {
              }
            }
            std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (piVar11,piVar10,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
            std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(piVar11,piVar10);
          }
          piVar11 = (int *)((long)piVar10 + lVar12);
        } while (piVar11 < piVar3);
      }
      pWVar7 = local_38;
      if ((local_50->kind_ == kManyMatch) && (uVar16 != 0)) {
        piVar3 = inst + local_48;
        lVar12 = 0x3f;
        if (local_48 != 0) {
          for (; local_48 >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (inst,piVar3,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(inst,piVar3);
      }
      if (pWVar7 != (Workq *)0x0) {
        uVar16 = uVar16 + 1;
        inst[local_48] = -2;
        if ((pWVar7->super_SparseSet).size_ != 0) {
          piVar3 = ((_Head_base<0UL,_int_*,_false> *)
                   ((long)&(pWVar7->super_SparseSet).dense_.ptr_._M_t.
                           super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                           super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> + 8))->
                   _M_head_impl;
          pIVar5 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
                   ((long)&(local_50->prog_->inst_).ptr_._M_t.
                           super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                   + 8))->_M_head_impl;
          piVar11 = piVar3;
          do {
            if ((pIVar5[*piVar11].out_opcode_ & 7) == 5) {
              lVar12 = (long)(int)uVar16;
              uVar16 = uVar16 + 1;
              *(anon_union_4_5_a14c903b_for_Inst_2 *)(inst + lVar12) = pIVar5[*piVar11].field_1;
            }
            piVar11 = piVar11 + 1;
          } while (piVar11 != piVar3 + (pWVar7->super_SparseSet).size_);
        }
      }
      pSVar9 = CachedState(local_50,inst,uVar16,local_3c | (int)local_58 << 0x10);
    }
  }
  if (inst != (int *)0x0) {
    operator_delete(inst);
  }
  return pSVar9;
}

Assistant:

DFA::State* DFA::WorkqToCachedState(Workq* q, Workq* mq, uint32_t flag) {
  //mutex_.AssertHeld();

  // Construct array of instruction ids for the new state.
  // Only ByteRange, EmptyWidth, and Match instructions are useful to keep:
  // those are the only operators with any effect in
  // RunWorkqOnEmptyString or RunWorkqOnByte.
  PODArray<int> inst(q->size());
  int n = 0;
  uint32_t needflags = 0;  // flags needed by kInstEmptyWidth instructions
  bool sawmatch = false;   // whether queue contains guaranteed kInstMatch
  bool sawmark = false;    // whether queue contains a Mark

  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    int id = *it;
    if (sawmatch && (kind_ == Prog::kFirstMatch || q->is_mark(id)))
      break;
    if (q->is_mark(id)) {
      if (n > 0 && inst[n-1] != Mark) {
        sawmark = true;
        inst[n++] = Mark;
      }
      continue;
    }
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      case kInstAltMatch:
        // This state will continue to a match no matter what
        // the rest of the input is.  If it is the highest priority match
        // being considered, return the special FullMatchState
        // to indicate that it's all matches from here out.
        if (kind_ != Prog::kManyMatch &&
            (kind_ != Prog::kFirstMatch ||
             (it == q->begin() && ip->greedy(prog_))) &&
            (kind_ != Prog::kLongestMatch || !sawmark) &&
            (flag & kFlagMatch)) {
          return FullMatchState;
        }
        FALLTHROUGH_INTENDED;
      default:
        // Record iff id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        if (prog_->inst(id-1)->last())
          inst[n++] = *it;
        if (ip->opcode() == kInstEmptyWidth)
          needflags |= ip->empty();
        if (ip->opcode() == kInstMatch && !prog_->anchor_end())
          sawmatch = true;
        break;
    }
  }
  DCHECK_LE(n, q->size());
  if (n > 0 && inst[n-1] == Mark)
    n--;

  // If there are no empty-width instructions waiting to execute,
  // then the extra flag bits will not be used, so there is no
  // point in saving them.  (Discarding them reduces the number
  // of distinct states.)
  if (needflags == 0)
    flag &= kFlagMatch;

  // NOTE(rsc): The code above cannot do flag &= needflags,
  // because if the right flags were present to pass the current
  // kInstEmptyWidth instructions, new kInstEmptyWidth instructions
  // might be reached that in turn need different flags.
  // The only sure thing is that if there are no kInstEmptyWidth
  // instructions at all, no flags will be needed.
  // We could do the extra work to figure out the full set of
  // possibly needed flags by exploring past the kInstEmptyWidth
  // instructions, but the check above -- are any flags needed
  // at all? -- handles the most common case.  More fine-grained
  // analysis can only be justified by measurements showing that
  // too many redundant states are being allocated.

  // If there are no Insts in the list, it's a dead state,
  // which is useful to signal with a special pointer so that
  // the execution loop can stop early.  This is only okay
  // if the state is *not* a matching state.
  if (n == 0 && flag == 0) {
    return DeadState;
  }

  // If we're in longest match mode, the state is a sequence of
  // unordered state sets separated by Marks.  Sort each set
  // to canonicalize, to reduce the number of distinct sets stored.
  if (kind_ == Prog::kLongestMatch) {
    int* ip = inst.data();
    int* ep = ip + n;
    while (ip < ep) {
      int* markp = ip;
      while (markp < ep && *markp != Mark)
        markp++;
      std::sort(ip, markp);
      if (markp < ep)
        markp++;
      ip = markp;
    }
  }

  // If we're in many match mode, canonicalize for similar reasons:
  // we have an unordered set of states (i.e. we don't have Marks)
  // and sorting will reduce the number of distinct sets stored.
  if (kind_ == Prog::kManyMatch) {
    int* ip = inst.data();
    int* ep = ip + n;
    std::sort(ip, ep);
  }

  // Append MatchSep and the match IDs in mq if necessary.
  if (mq != NULL) {
    inst[n++] = MatchSep;
    for (Workq::iterator i = mq->begin(); i != mq->end(); ++i) {
      int id = *i;
      Prog::Inst* ip = prog_->inst(id);
      if (ip->opcode() == kInstMatch)
        inst[n++] = ip->match_id();
    }
  }

  // Save the needed empty-width flags in the top bits for use later.
  flag |= needflags << kFlagNeedShift;

  State* state = CachedState(inst.data(), n, flag);
  return state;
}